

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5TermsetAdd(Fts5Termset *p,int iIdx,char *pTerm,int nTerm,int *pbPresent)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  undefined8 *puVar4;
  int in_ECX;
  void *in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined4 *in_R8;
  long in_FS_OFFSET;
  Fts5TermsetEntry *pEntry;
  u32 hash;
  int i;
  int rc;
  sqlite3_int64 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined8 *local_48;
  uint local_40;
  int local_3c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_R8 = 0;
  if (in_RDI != 0) {
    local_40 = 0xd;
    for (local_3c = in_ECX + -1; -1 < local_3c; local_3c = local_3c + -1) {
      local_40 = local_40 << 3 ^ local_40 ^ (int)*(char *)((long)in_RDX + (long)local_3c);
    }
    uVar2 = (local_40 << 3 ^ local_40 ^ in_ESI) & 0x1ff;
    for (local_48 = *(undefined8 **)(in_RDI + (ulong)uVar2 * 8); local_48 != (undefined8 *)0x0;
        local_48 = (undefined8 *)local_48[2]) {
      if (((*(uint *)((long)local_48 + 0xc) == in_ESI) && (*(int *)(local_48 + 1) == in_ECX)) &&
         (iVar3 = memcmp((void *)*local_48,in_RDX,(long)in_ECX), iVar3 == 0)) {
        *in_R8 = 1;
        break;
      }
    }
    if ((local_48 == (undefined8 *)0x0) &&
       (puVar4 = (undefined8 *)
                 sqlite3Fts5MallocZero
                           ((int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffa8), puVar4 != (undefined8 *)0x0)) {
      *puVar4 = puVar4 + 3;
      *(int *)(puVar4 + 1) = in_ECX;
      *(uint *)((long)puVar4 + 0xc) = in_ESI;
      memcpy((void *)*puVar4,in_RDX,(long)in_ECX);
      puVar4[2] = *(undefined8 *)(in_RDI + (ulong)uVar2 * 8);
      *(undefined8 **)(in_RDI + (ulong)uVar2 * 8) = puVar4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return 0;
}

Assistant:

static int sqlite3Fts5TermsetAdd(
  Fts5Termset *p,
  int iIdx,
  const char *pTerm, int nTerm,
  int *pbPresent
){
  int rc = SQLITE_OK;
  *pbPresent = 0;
  if( p ){
    int i;
    u32 hash = 13;
    Fts5TermsetEntry *pEntry;

    /* Calculate a hash value for this term. This is the same hash checksum
    ** used by the fts5_hash.c module. This is not important for correct
    ** operation of the module, but is necessary to ensure that some tests
    ** designed to produce hash table collisions really do work.  */
    for(i=nTerm-1; i>=0; i--){
      hash = (hash << 3) ^ hash ^ pTerm[i];
    }
    hash = (hash << 3) ^ hash ^ iIdx;
    hash = hash % ArraySize(p->apHash);

    for(pEntry=p->apHash[hash]; pEntry; pEntry=pEntry->pNext){
      if( pEntry->iIdx==iIdx
          && pEntry->nTerm==nTerm
          && memcmp(pEntry->pTerm, pTerm, nTerm)==0
      ){
        *pbPresent = 1;
        break;
      }
    }

    if( pEntry==0 ){
      pEntry = sqlite3Fts5MallocZero(&rc, sizeof(Fts5TermsetEntry) + nTerm);
      if( pEntry ){
        pEntry->pTerm = (char*)&pEntry[1];
        pEntry->nTerm = nTerm;
        pEntry->iIdx = iIdx;
        memcpy(pEntry->pTerm, pTerm, nTerm);
        pEntry->pNext = p->apHash[hash];
        p->apHash[hash] = pEntry;
      }
    }
  }

  return rc;
}